

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall capnp::anon_unknown_79::Input::advance(Input *this,size_t numBytes)

{
  Fault f;
  DebugComparison<unsigned_long_&,_unsigned_long> _kjCondition;
  size_t numBytes_local;
  
  _kjCondition.left = &numBytes_local;
  _kjCondition.right = (this->wrapped).size_;
  _kjCondition.op.content.ptr = " <= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = numBytes <= _kjCondition.right;
  if (_kjCondition.result) {
    (this->wrapped).ptr = (this->wrapped).ptr + numBytes;
    (this->wrapped).size_ = _kjCondition.right - numBytes;
    return;
  }
  numBytes_local = numBytes;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&,char_const(&)[31]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x231,FAILED,"numBytes <= wrapped.size()",
             "_kjCondition,\"JSON message ends prematurely.\"",&_kjCondition,
             (char (*) [31])"JSON message ends prematurely.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void advance(size_t numBytes = 1) {
    KJ_REQUIRE(numBytes <= wrapped.size(), "JSON message ends prematurely.");
    wrapped = kj::arrayPtr(wrapped.begin() + numBytes, wrapped.end());
  }